

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProxy.cpp
# Opt level: O2

void __thiscall ImageProxy::Save(ImageProxy *this,ostream *to)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)operator<<(to,&this->_extent);
  std::operator<<(poVar1,this->_fileName);
  return;
}

Assistant:

void ImageProxy::Save (ostream& to) {
    to << _extent << _fileName;
}